

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::ClientImpl::~ClientImpl(ClientImpl *this)

{
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_001416a0;
  lock_socket_and_shutdown_and_close(this);
  std::_Function_base::~_Function_base(&(this->logger_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->proxy_bearer_token_auth_token_);
  std::__cxx11::string::~string((string *)&this->proxy_basic_auth_password_);
  std::__cxx11::string::~string((string *)&this->proxy_basic_auth_username_);
  std::__cxx11::string::~string((string *)&this->proxy_host_);
  std::__cxx11::string::~string((string *)&this->interface_);
  std::_Function_base::~_Function_base(&(this->socket_options_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->bearer_token_auth_token_);
  std::__cxx11::string::~string((string *)&this->basic_auth_password_);
  std::__cxx11::string::~string((string *)&this->basic_auth_username_);
  std::__cxx11::string::~string((string *)&this->client_key_path_);
  std::__cxx11::string::~string((string *)&this->client_cert_path_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->default_headers_)._M_t);
  std::__cxx11::string::~string((string *)&this->host_and_port_);
  std::__cxx11::string::~string((string *)&this->host_);
  return;
}

Assistant:

inline ClientImpl::~ClientImpl() { lock_socket_and_shutdown_and_close(); }